

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::resize(SmallVectorImpl<unsigned_char> *this,size_type N)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if (uVar2 <= N) {
    if (N <= uVar2) {
      return;
    }
    if ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity < N) {
      SmallVectorTemplateBase<unsigned_char,_true>::grow
                (&this->super_SmallVectorTemplateBase<unsigned_char,_true>,N);
      uVar2 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                     super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size
      ;
    }
    pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    for (; N != uVar2; uVar2 = uVar2 + 1) {
      *(undefined1 *)((long)pvVar1 + uVar2) = 0;
    }
  }
  SmallVectorBase::set_size((SmallVectorBase *)this,N);
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }